

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_q.c
# Opt level: O0

void test_q(void)

{
  wchar_t wVar1;
  int r;
  char *reffile;
  
  extract_reference_file("test_basic.zip");
  wVar1 = systemf("%s -q %s >test.out 2>test.err",testprog,"test_basic.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_q.c"
                      ,L'\x11',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_q.c"
             ,L'\x12',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_q.c"
             ,L'\x13',"test.err");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_q.c"
             ,L'\x15',"contents a\n","test_basic/a");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_q.c"
             ,L'\x16',"contents b\n","test_basic/b");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_q.c"
             ,L'\x17',"contents c\n","test_basic/c");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_q.c"
             ,L'\x18',"contents CAPS\n","test_basic/CAPS");
  return;
}

Assistant:

DEFINE_TEST(test_q)
{
	const char *reffile = "test_basic.zip";
	int r;

	extract_reference_file(reffile);
	r = systemf("%s -q %s >test.out 2>test.err", testprog, reffile);
	assertEqualInt(0, r);
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");

	assertTextFileContents("contents a\n", "test_basic/a");
	assertTextFileContents("contents b\n", "test_basic/b");
	assertTextFileContents("contents c\n", "test_basic/c");
	assertTextFileContents("contents CAPS\n", "test_basic/CAPS");
}